

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalized_cepstrum_inverse_gain_normalization.cc
# Opt level: O3

bool __thiscall
sptk::GeneralizedCepstrumInverseGainNormalization::Run
          (GeneralizedCepstrumInverseGainNormalization *this,
          vector<double,_std::allocator<double>_> *normalized_generalized_cepstrum,
          vector<double,_std::allocator<double>_> *generalized_cepstrum)

{
  double __x;
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  pointer pdVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  pointer __src;
  double dVar6;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (generalized_cepstrum != (vector<double,_std::allocator<double>_> *)0x0) {
      lVar3 = (long)(normalized_generalized_cepstrum->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(normalized_generalized_cepstrum->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      __new_size = lVar3 >> 3;
      bVar5 = false;
      if (__new_size == (long)this->num_order_ + 1U) {
        if ((long)(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_start != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize(generalized_cepstrum,__new_size);
        }
        dVar6 = this->gamma_;
        __x = *(normalized_generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>
               )._M_impl.super__Vector_impl_data._M_start;
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          dVar6 = pow(__x,dVar6);
          pdVar4 = (generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *pdVar4 = (dVar6 + -1.0) / this->gamma_;
          pdVar1 = (normalized_generalized_cepstrum->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = (normalized_generalized_cepstrum->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar5 = true;
          while (pdVar1 = pdVar1 + 1, pdVar1 != pdVar2) {
            pdVar4 = pdVar4 + 1;
            *pdVar4 = *pdVar1 * dVar6;
          }
        }
        else {
          dVar6 = log(__x);
          pdVar4 = (generalized_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          *pdVar4 = dVar6;
          __src = (normalized_generalized_cepstrum->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + 1;
          bVar5 = true;
          __n = (long)(normalized_generalized_cepstrum->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src;
          if (__n != 0) {
            memmove(pdVar4 + 1,__src,__n);
          }
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool GeneralizedCepstrumInverseGainNormalization::Run(
    const std::vector<double>& normalized_generalized_cepstrum,
    std::vector<double>* generalized_cepstrum) const {
  // Check inputs.
  if (!is_valid_ ||
      normalized_generalized_cepstrum.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == generalized_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (generalized_cepstrum->size() !=
      static_cast<std::size_t>(num_order_ + 1)) {
    generalized_cepstrum->resize(num_order_ + 1);
  }

  if (0.0 == gamma_) {
    (*generalized_cepstrum)[0] = std::log(normalized_generalized_cepstrum[0]);
    std::copy(normalized_generalized_cepstrum.begin() + 1,
              normalized_generalized_cepstrum.end(),
              generalized_cepstrum->begin() + 1);
  } else {
    const double z(std::pow(normalized_generalized_cepstrum[0], gamma_));
    (*generalized_cepstrum)[0] = (z - 1.0) / gamma_;
    std::transform(normalized_generalized_cepstrum.begin() + 1,
                   normalized_generalized_cepstrum.end(),
                   generalized_cepstrum->begin() + 1,
                   [z](double c) { return c * z; });
  }

  return true;
}